

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

void __thiscall test_app::upperA::~upperA(upperA *this)

{
  void *in_RDI;
  
  ~upperA((upperA *)0x1236c8);
  operator_delete(in_RDI);
  return;
}

Assistant:

int convert(char const *begin,char const *end,std::streambuf *out)
		{
			while(begin!=end) {
				char c=*begin++;
				if('a'<=c && c<='z')
					c = 'A' + (c-'a');
				if(out->sputc(c)==EOF)
					return -1;
			}
			return 0;
		}